

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

void __thiscall rlib::JsonT<void>::JsonT(JsonT<void> *this,JsonT<void> *s)

{
  Type TVar1;
  size_type sVar2;
  
  TVar1 = s->m_type;
  this->m_type = TVar1;
  switch(TVar1) {
  case Bool:
    (this->field_1).m_bool = (s->field_1).m_bool;
    break;
  case Float:
    (this->field_1).m_float = (s->field_1).m_float;
    return;
  case Int:
    (this->field_1).m_float = (s->field_1).m_float;
    return;
  case String:
    std::__cxx11::string::string
              ((string *)&(this->field_1).m_string,(string *)&(s->field_1).m_string);
    return;
  case Array:
    sVar2 = (s->field_1).m_string._M_string_length;
    (this->field_1).m_float = (s->field_1).m_float;
    (this->field_1).m_string._M_string_length = sVar2;
    *(undefined8 *)((long)&this->field_1 + 0x10) = *(undefined8 *)((long)&s->field_1 + 0x10);
    (s->field_1).m_float = 0.0;
    (s->field_1).m_string._M_string_length = 0;
    *(undefined8 *)((long)&s->field_1 + 0x10) = 0;
    return;
  case Map:
    std::_Rb_tree_header::_Rb_tree_header
              (&(this->field_1).m_map._M_t._M_impl.super__Rb_tree_header,
               &(s->field_1).m_map._M_t._M_impl.super__Rb_tree_header);
    return;
  }
  return;
}

Assistant:

JsonT(JsonT&& s)
			:m_type(s.m_type)
		{
			switch (m_type) {
			case Type::Null:																break;
			case Type::Bool:	m_bool = s.m_bool;											break;
			case Type::Float:	m_float = s.m_float;										break;
			case Type::Int:		m_int = s.m_int;											break;
			case Type::String:	new(&m_string) decltype(m_string)(std::move(s.m_string));	break;
			case Type::Array:	new(&m_array) decltype(m_array)(std::move(s.m_array));		break;
			case Type::Map:		new(&m_map) decltype(m_map)(std::move(s.m_map));			break;
			default:			assert(false);
			}
		}